

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O2

bool deqp::gles31::Functional::anon_unknown_3::traverseVariablePath
               (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                *typePath,char *subPath,VarType *type)

{
  pointer pSVar1;
  char *__lhs;
  long lVar2;
  bool bVar3;
  byte bVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  VarTokenizer tokenizer;
  Data local_50;
  undefined4 local_48;
  
  glu::VarTokenizer::VarTokenizer(&tokenizer,subPath);
  local_48 = 0;
  local_50.type = type;
  std::
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  ::emplace_back<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>
            (typePath,(VariablePathComponent *)&local_50);
  bVar3 = true;
  if (tokenizer.m_token != TOKEN_END) {
    if (type->m_type == TYPE_ARRAY) {
      if (((tokenizer.m_token == TOKEN_LEFT_BRACKET) &&
          (glu::VarTokenizer::advance(&tokenizer), tokenizer.m_token == TOKEN_NUMBER)) &&
         (glu::VarTokenizer::advance(&tokenizer), tokenizer.m_token == TOKEN_RIGHT_BRACKET)) {
        bVar3 = traverseVariablePath
                          (typePath,subPath + (tokenizer.m_tokenLen + tokenizer.m_tokenStart),
                           (type->m_data).array.elementType);
        return bVar3;
      }
    }
    else if (((type->m_type == TYPE_STRUCT) && (tokenizer.m_token == TOKEN_PERIOD)) &&
            (glu::VarTokenizer::advance(&tokenizer), tokenizer.m_token == TOKEN_IDENTIFIER)) {
      lVar6 = -1;
      lVar2 = -0x18;
      do {
        lVar5 = lVar2;
        pSVar1 = (((type->m_data).structPtr)->m_members).
                 super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
                 super__Vector_impl_data._M_start;
        bVar4 = 0x38;
        lVar7 = (long)(int)(((long)(((type->m_data).structPtr)->m_members).
                                   super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x38
                           );
        lVar6 = lVar6 + 1;
        if (lVar7 <= lVar6) goto LAB_013cad9b;
        __lhs = *(char **)((long)&(pSVar1->m_name).field_2 + lVar5 + 8U);
        glu::VarTokenizer::getIdentifier_abi_cxx11_((string *)&local_50,&tokenizer);
        bVar3 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        lVar2 = lVar5 + 0x38;
      } while (!bVar3);
      bVar4 = traverseVariablePath
                        (typePath,subPath + (tokenizer.m_tokenLen + tokenizer.m_tokenStart),
                         (VarType *)
                         ((long)&(((type->m_data).structPtr)->m_members).
                                 super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].m_name._M_dataplus.
                                 _M_p + lVar5));
LAB_013cad9b:
      return (bool)(lVar6 < lVar7 & bVar4);
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool traverseVariablePath (std::vector<VariablePathComponent>& typePath, const char* subPath, const glu::VarType& type)
{
	glu::VarTokenizer tokenizer(subPath);

	typePath.push_back(VariablePathComponent(&type));

	if (tokenizer.getToken() == glu::VarTokenizer::TOKEN_END)
		return true;

	if (type.isStructType() && tokenizer.getToken() == glu::VarTokenizer::TOKEN_PERIOD)
	{
		tokenizer.advance();

		// malformed path
		if (tokenizer.getToken() != glu::VarTokenizer::TOKEN_IDENTIFIER)
			return false;

		for (int memberNdx = 0; memberNdx < type.getStructPtr()->getNumMembers(); ++memberNdx)
			if (type.getStructPtr()->getMember(memberNdx).getName() == tokenizer.getIdentifier())
				return traverseVariablePath(typePath, subPath + tokenizer.getCurrentTokenEndLocation(), type.getStructPtr()->getMember(memberNdx).getType());

		// malformed path, no such member
		return false;
	}
	else if (type.isArrayType() && tokenizer.getToken() == glu::VarTokenizer::TOKEN_LEFT_BRACKET)
	{
		tokenizer.advance();

		// malformed path
		if (tokenizer.getToken() != glu::VarTokenizer::TOKEN_NUMBER)
			return false;

		tokenizer.advance();
		if (tokenizer.getToken() != glu::VarTokenizer::TOKEN_RIGHT_BRACKET)
			return false;

		return traverseVariablePath(typePath, subPath + tokenizer.getCurrentTokenEndLocation(), type.getElementType());
	}

	return false;
}